

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  _Bool _Var1;
  CURLcode CVar2;
  size_t local_60;
  byte local_51;
  undefined1 local_50 [7];
  uchar in;
  dynbuf d;
  size_t length;
  byte *pbStack_20;
  int inlength_local;
  char *string_local;
  Curl_easy *data_local;
  
  if (inlength < 0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    Curl_dyn_init((dynbuf *)local_50,24000000);
    if (inlength == 0) {
      local_60 = strlen(string);
    }
    else {
      local_60 = (size_t)inlength;
    }
    d.toobig = local_60;
    pbStack_20 = (byte *)string;
    if (local_60 == 0) {
      data_local = (Curl_easy *)(*Curl_cstrdup)("");
    }
    else {
      while (d.toobig != 0) {
        local_51 = *pbStack_20;
        d.toobig = d.toobig - 1;
        _Var1 = Curl_isunreserved(local_51);
        if (_Var1) {
          CVar2 = Curl_dyn_addn((dynbuf *)local_50,&local_51,1);
          if (CVar2 != CURLE_OK) {
            return (char *)0x0;
          }
        }
        else {
          CVar2 = Curl_dyn_addf((dynbuf *)local_50,"%%%02X",(ulong)local_51);
          if (CVar2 != CURLE_OK) {
            return (char *)0x0;
          }
        }
        pbStack_20 = pbStack_20 + 1;
      }
      d.toobig = d.toobig - 1;
      data_local = (Curl_easy *)Curl_dyn_ptr((dynbuf *)local_50);
    }
  }
  return (char *)data_local;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t length;
  struct dynbuf d;
  (void)data;

  if(inlength < 0)
    return NULL;

  Curl_dyn_init(&d, CURL_MAX_INPUT_LENGTH * 3);

  length = (inlength?(size_t)inlength:strlen(string));
  if(!length)
    return strdup("");

  while(length--) {
    unsigned char in = *string; /* we need to treat the characters unsigned */

    if(Curl_isunreserved(in)) {
      /* append this */
      if(Curl_dyn_addn(&d, &in, 1))
        return NULL;
    }
    else {
      /* encode it */
      if(Curl_dyn_addf(&d, "%%%02X", in))
        return NULL;
    }
    string++;
  }

  return Curl_dyn_ptr(&d);
}